

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultisampleCase::renderLine
          (MultisampleCase *this,Vec2 *p0,Vec2 *p1,Vec4 *color)

{
  GLenum GVar1;
  deBool dVar2;
  deUint32 program;
  float local_68;
  float local_64;
  float vertexColors [8];
  float vertexPositions [8];
  Vec4 *color_local;
  Vec2 *p1_local;
  Vec2 *p0_local;
  MultisampleCase *this_local;
  
  vertexColors[6] = tcu::Vector<float,_2>::x(p0);
  vertexColors[7] = tcu::Vector<float,_2>::y(p0);
  tcu::Vector<float,_2>::x(p1);
  tcu::Vector<float,_2>::y(p1);
  local_68 = tcu::Vector<float,_4>::x(color);
  local_64 = tcu::Vector<float,_4>::y(color);
  vertexColors[0] = tcu::Vector<float,_4>::z(color);
  vertexColors[1] = tcu::Vector<float,_4>::w(color);
  vertexColors[2] = tcu::Vector<float,_4>::x(color);
  vertexColors[3] = tcu::Vector<float,_4>::y(color);
  vertexColors[4] = tcu::Vector<float,_4>::z(color);
  vertexColors[5] = tcu::Vector<float,_4>::w(color);
  do {
    glwEnableVertexAttribArray(this->m_attrPositionLoc);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrPositionLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x127);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwVertexAttribPointer(this->m_attrPositionLoc,4,0x1406,'\0',0,vertexColors + 6);
    GVar1 = glwGetError();
    glu::checkError(GVar1,
                    "glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x128);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwEnableVertexAttribArray(this->m_attrColorLoc);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnableVertexAttribArray(m_attrColorLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x12a);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwVertexAttribPointer(this->m_attrColorLoc,4,0x1406,'\0',0,&local_68);
    GVar1 = glwGetError();
    glu::checkError(GVar1,
                    "glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,299);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    program = glu::ShaderProgram::getProgram(this->m_program);
    glwUseProgram(program);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glUseProgram(m_program->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x12d);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    glwDrawArrays(1,0,2);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glDrawArrays(GL_LINES, 0, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                    ,0x12e);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  return;
}

Assistant:

void MultisampleCase::renderLine (const Vec2& p0, const Vec2& p1, const Vec4& color) const
{
	float vertexPositions[] =
	{
		p0.x(), p0.y(), 0.0f, 1.0f,
		p1.x(), p1.y(), 0.0f, 1.0f
	};
	float vertexColors[] =
	{
		color.x(), color.y(), color.z(), color.w(),
		color.x(), color.y(), color.z(), color.w()
	};

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrPositionLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrPositionLoc, 4, GL_FLOAT, false, 0, &vertexPositions[0]));

	GLU_CHECK_CALL(glEnableVertexAttribArray(m_attrColorLoc));
	GLU_CHECK_CALL(glVertexAttribPointer(m_attrColorLoc, 4, GL_FLOAT, false, 0, &vertexColors[0]));

	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));
	GLU_CHECK_CALL(glDrawArrays(GL_LINES, 0, 2));
}